

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

void __thiscall argo::token::token(token *this,token *other)

{
  this->_vptr_token = (_func_int **)&PTR__token_0011bd48;
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  (this->m_raw_value)._M_string_length = 0;
  (this->m_raw_value).field_2._M_local_buf[0] = '\0';
  if (this != other) {
    this->m_type = other->m_type;
    std::__cxx11::string::_M_assign((string *)&this->m_raw_value);
  }
  return;
}

Assistant:

token::token(token &&other)
{
    *this = other;
}